

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

void des3_set2key(uint32_t *esk,uint32_t *dsk,uchar *key)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  mbedtls_des_setkey(esk,key);
  mbedtls_des_setkey(dsk + 0x20,key + 8);
  lVar1 = 0x3f;
  lVar2 = 0x40;
  do {
    dsk[lVar2 + -0x40] = esk[lVar1 + -0x21];
    dsk[lVar2 + -0x3f] = esk[lVar1 + -0x20];
    esk[lVar2 + -0x20] = dsk[lVar1 + -1];
    esk[lVar2 + -0x1f] = dsk[lVar1];
    *(undefined8 *)(esk + lVar2) = *(undefined8 *)(esk + lVar2 + -0x40);
    *(undefined8 *)(dsk + lVar2) = *(undefined8 *)(dsk + lVar2 + -0x40);
    uVar3 = lVar2 - 0x40;
    lVar1 = lVar1 + -2;
    lVar2 = lVar2 + 2;
  } while (uVar3 < 0x1e);
  return;
}

Assistant:

static void des3_set2key( uint32_t esk[96],
                          uint32_t dsk[96],
                          const unsigned char key[MBEDTLS_DES_KEY_SIZE*2] )
{
    int i;

    mbedtls_des_setkey( esk, key );
    mbedtls_des_setkey( dsk + 32, key + 8 );

    for( i = 0; i < 32; i += 2 )
    {
        dsk[i     ] = esk[30 - i];
        dsk[i +  1] = esk[31 - i];

        esk[i + 32] = dsk[62 - i];
        esk[i + 33] = dsk[63 - i];

        esk[i + 64] = esk[i    ];
        esk[i + 65] = esk[i + 1];

        dsk[i + 64] = dsk[i    ];
        dsk[i + 65] = dsk[i + 1];
    }
}